

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlistview.cpp
# Opt level: O0

void QListView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  Movement MVar2;
  Flow FVar3;
  ResizeMode RVar4;
  LayoutMode LVar5;
  ViewMode VVar6;
  int iVar7;
  Alignment AVar8;
  QMetaType QVar9;
  QSize QVar10;
  QListView *this;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QListView *_t;
  undefined4 in_stack_ffffffffffffff78;
  ResizeMode in_stack_ffffffffffffff7c;
  QListView *in_stack_ffffffffffffff80;
  QListView *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff98;
  QSize *pQVar11;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  code *in_stack_ffffffffffffffa0;
  ViewMode mode;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  alignment.i = (Int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  mode = (ViewMode)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI == 0) && (in_EDX == 0)) {
    indexesMoved(in_stack_ffffffffffffff80,
                 (QModelIndexList *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  if (in_ESI == 7) {
    if (in_EDX == 0) {
      if (**(int **)(in_RCX + 8) == 0) {
        QVar9 = QMetaType::fromType<QList<QModelIndex>>();
        **(undefined8 **)in_RCX = QVar9.d_ptr;
      }
      else {
        memset(&local_18,0,8);
        QMetaType::QMetaType(&local_18);
        **(undefined8 **)in_RCX = local_18.d_ptr;
      }
    }
    else {
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
      **(undefined8 **)in_RCX = local_10.d_ptr;
    }
  }
  if (in_ESI == 5) {
    in_stack_ffffffffffffffa0 = indexesMoved;
    bVar1 = QtMocHelpers::indexOfMethod<void(QListView::*)(QList<QModelIndex>const&)>
                      (in_RCX,(void **)indexesMoved,0,0);
    if (bVar1) goto switchD_008887eb_default;
  }
  if (in_ESI == 1) {
    pQVar11 = *(QSize **)in_RCX;
    in_stack_ffffffffffffff88 = (QListView *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff88) {
    case (QListView *)0x0:
      MVar2 = movement(in_stack_ffffffffffffff80);
      (pQVar11->wd).m_i = MVar2;
      break;
    case (QListView *)0x1:
      FVar3 = flow(in_stack_ffffffffffffff80);
      (pQVar11->wd).m_i = FVar3;
      break;
    case (QListView *)0x2:
      bVar1 = isWrapping(in_stack_ffffffffffffff80);
      *(bool *)&(pQVar11->wd).m_i = bVar1;
      break;
    case (QListView *)0x3:
      RVar4 = resizeMode(in_stack_ffffffffffffff80);
      (pQVar11->wd).m_i = RVar4;
      break;
    case (QListView *)0x4:
      LVar5 = layoutMode(in_stack_ffffffffffffff80);
      (pQVar11->wd).m_i = LVar5;
      break;
    case (QListView *)0x5:
      iVar7 = spacing(in_stack_ffffffffffffff80);
      (pQVar11->wd).m_i = iVar7;
      break;
    case (QListView *)0x6:
      QVar10 = gridSize((QListView *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      *pQVar11 = QVar10;
      break;
    case (QListView *)0x7:
      VVar6 = viewMode(in_stack_ffffffffffffff80);
      (pQVar11->wd).m_i = VVar6;
      break;
    case (QListView *)0x8:
      iVar7 = modelColumn(in_stack_ffffffffffffff80);
      (pQVar11->wd).m_i = iVar7;
      break;
    case (QListView *)0x9:
      bVar1 = uniformItemSizes(in_stack_ffffffffffffff80);
      *(bool *)&(pQVar11->wd).m_i = bVar1;
      break;
    case (QListView *)0xa:
      iVar7 = batchSize(in_stack_ffffffffffffff80);
      (pQVar11->wd).m_i = iVar7;
      break;
    case (QListView *)0xb:
      bVar1 = wordWrap(in_stack_ffffffffffffff80);
      *(bool *)&(pQVar11->wd).m_i = bVar1;
      break;
    case (QListView *)0xc:
      bVar1 = isSelectionRectVisible(in_stack_ffffffffffffff80);
      *(bool *)&(pQVar11->wd).m_i = bVar1;
      break;
    case (QListView *)0xd:
      AVar8 = itemAlignment(in_stack_ffffffffffffff80);
      (pQVar11->wd).m_i =
           (int)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                super_QFlagsStorage<Qt::AlignmentFlag>.i;
    }
    alignment.i = (Int)((ulong)pQVar11 >> 0x20);
  }
  if (in_ESI == 2) {
    this = (QListView *)(ulong)in_EDX;
    bVar1 = SUB41(in_stack_ffffffffffffff7c >> 0x18,0);
    switch(this) {
    case (QListView *)0x0:
      setMovement(*(QListView **)in_RCX,(Movement)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      break;
    case (QListView *)0x1:
      setFlow(this,in_stack_ffffffffffffff7c);
      break;
    case (QListView *)0x2:
      setWrapping(this,bVar1);
      break;
    case (QListView *)0x3:
      setResizeMode(this,in_stack_ffffffffffffff7c);
      break;
    case (QListView *)0x4:
      setLayoutMode(this,in_stack_ffffffffffffff7c);
      break;
    case (QListView *)0x5:
      setSpacing(this,in_stack_ffffffffffffff7c);
      break;
    case (QListView *)0x6:
      setGridSize(this,(QSize *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      break;
    case (QListView *)0x7:
      setViewMode((QListView *)in_RCX,mode);
      break;
    case (QListView *)0x8:
      setModelColumn((QListView *)in_stack_ffffffffffffffa0,alignment.i);
      break;
    case (QListView *)0x9:
      setUniformItemSizes(this,bVar1);
      break;
    case (QListView *)0xa:
      setBatchSize(in_stack_ffffffffffffff88,0);
      break;
    case (QListView *)0xb:
      setWordWrap(this,bVar1);
      break;
    case (QListView *)0xc:
      setSelectionRectVisible(this,bVar1);
      break;
    case (QListView *)0xd:
      setItemAlignment(in_stack_ffffffffffffff88,(Alignment)alignment.i);
    }
  }
switchD_008887eb_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QListView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->indexesMoved((*reinterpret_cast< std::add_pointer_t<QModelIndexList>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QModelIndexList >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QListView::*)(const QModelIndexList & )>(_a, &QListView::indexesMoved, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Movement*>(_v) = _t->movement(); break;
        case 1: *reinterpret_cast<Flow*>(_v) = _t->flow(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isWrapping(); break;
        case 3: *reinterpret_cast<ResizeMode*>(_v) = _t->resizeMode(); break;
        case 4: *reinterpret_cast<LayoutMode*>(_v) = _t->layoutMode(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->spacing(); break;
        case 6: *reinterpret_cast<QSize*>(_v) = _t->gridSize(); break;
        case 7: *reinterpret_cast<ViewMode*>(_v) = _t->viewMode(); break;
        case 8: *reinterpret_cast<int*>(_v) = _t->modelColumn(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->uniformItemSizes(); break;
        case 10: *reinterpret_cast<int*>(_v) = _t->batchSize(); break;
        case 11: *reinterpret_cast<bool*>(_v) = _t->wordWrap(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->isSelectionRectVisible(); break;
        case 13: *reinterpret_cast<Qt::Alignment*>(_v) = _t->itemAlignment(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setMovement(*reinterpret_cast<Movement*>(_v)); break;
        case 1: _t->setFlow(*reinterpret_cast<Flow*>(_v)); break;
        case 2: _t->setWrapping(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setResizeMode(*reinterpret_cast<ResizeMode*>(_v)); break;
        case 4: _t->setLayoutMode(*reinterpret_cast<LayoutMode*>(_v)); break;
        case 5: _t->setSpacing(*reinterpret_cast<int*>(_v)); break;
        case 6: _t->setGridSize(*reinterpret_cast<QSize*>(_v)); break;
        case 7: _t->setViewMode(*reinterpret_cast<ViewMode*>(_v)); break;
        case 8: _t->setModelColumn(*reinterpret_cast<int*>(_v)); break;
        case 9: _t->setUniformItemSizes(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setBatchSize(*reinterpret_cast<int*>(_v)); break;
        case 11: _t->setWordWrap(*reinterpret_cast<bool*>(_v)); break;
        case 12: _t->setSelectionRectVisible(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setItemAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        default: break;
        }
    }
}